

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_alignof(lua_State *L)

{
  CTInfo CVar1;
  lua_State *in_RDI;
  CTInfo info;
  CTSize sz;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  TValue *in_stack_00000048;
  CTState *in_stack_00000050;
  lua_State *in_stack_00000058;
  CTSize local_38;
  CTypeID local_34;
  CTState *local_30;
  lua_State *local_28;
  CTState *local_10;
  
  local_30 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0xfc);
  local_30->L = in_RDI;
  local_28 = in_RDI;
  local_10 = local_30;
  local_34 = ffi_checkctype(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  local_38 = 0;
  CVar1 = lj_ctype_info(local_30,local_34,&local_38);
  local_28->top[-1].n = (double)(1 << ((byte)(CVar1 >> 0x10) & 0xf));
  return 1;
}

Assistant:

LJLIB_CF(ffi_alignof)	LJLIB_REC(ffi_xof FF_ffi_alignof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz = 0;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  setintV(L->top-1, 1 << ctype_align(info));
  return 1;
}